

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O1

void crnlib::FillDistancesPrices(CLzmaEnc *p)

{
  byte bVar1;
  byte bVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  UInt32 UVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  CLzmaEnc *pCVar10;
  long lVar11;
  uint uVar12;
  UInt32 (*paUVar13) [64];
  uint uVar14;
  ulong uVar15;
  long lVar16;
  int aiStack_228 [126];
  
  lVar5 = 4;
  do {
    bVar1 = p->g_FastPos[lVar5];
    iVar4 = (bVar1 >> 1) - 1;
    bVar2 = (byte)iVar4 & 0x1f;
    uVar7 = (bVar1 & 1 | 2) << bVar2;
    if (iVar4 == 0) {
      iVar8 = 0;
    }
    else {
      uVar9 = (int)lVar5 - uVar7;
      iVar8 = 0 << bVar2;
      uVar14 = 1;
      do {
        uVar12 = uVar9 & 1;
        uVar15 = (ulong)uVar14;
        uVar14 = uVar12 + uVar14 * 2;
        uVar9 = uVar9 >> 1;
        iVar8 = iVar8 + p->ProbPrices
                        [(-uVar12 & 0x7f0 ^
                         (uint)*(ushort *)
                                ((long)p +
                                uVar15 * 2 + ((ulong)uVar7 * 2 - (ulong)((uint)bVar1 * 2)) + 0x34146
                                )) >> 4];
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    aiStack_228[lVar5 + -4] = iVar8;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x80);
  lVar5 = 0;
  lVar11 = 0;
  pCVar10 = p;
  do {
    paUVar13 = p->posSlotPrices + lVar11;
    if (p->distTableSize != 0) {
      uVar15 = 0;
      do {
        UVar6 = 0;
        uVar7 = (uint)uVar15 | 0x40;
        do {
          uVar14 = uVar7 >> 1;
          UVar6 = UVar6 + p->ProbPrices
                          [(-(uVar7 & 1) & 0x7f0 ^
                           (uint)*(ushort *)
                                  ((long)p->posSlotEncoder[lVar11] + (ulong)(uVar7 & 0xfffffffe)))
                           >> 4];
          uVar7 = uVar14;
        } while (uVar14 != 1);
        (*paUVar13)[uVar15] = UVar6;
        uVar15 = uVar15 + 1;
      } while (uVar15 < p->distTableSize);
    }
    if (0xe < p->distTableSize) {
      uVar7 = 0x70;
      lVar16 = 0xcbef;
      do {
        *(uint *)((long)&(pCVar10->matchFinder).Init + lVar16 * 4) =
             (uVar7 & 0xfffffff0) + *(int *)((long)&(pCVar10->matchFinder).Init + lVar16 * 4) +
             -0x50;
        uVar7 = uVar7 + 8;
        uVar15 = lVar16 - 0xcbe0;
        lVar16 = lVar16 + 1;
      } while (uVar15 < p->distTableSize);
    }
    uVar3 = *(undefined8 *)(*paUVar13 + 2);
    *(undefined8 *)p->distancesPrices[lVar11] = *(undefined8 *)*paUVar13;
    *(undefined8 *)(p->distancesPrices[lVar11] + 2) = uVar3;
    lVar16 = 0;
    do {
      *(UInt32 *)((long)p->distancesPrices[0] + lVar16 * 4 + lVar5 + 0x10) =
           aiStack_228[lVar16] + (*paUVar13)[p->g_FastPos[lVar16 + 4]];
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x7c);
    lVar11 = lVar11 + 1;
    pCVar10 = (CLzmaEnc *)((pCVar10->matchFinderBase).crc + 0x11);
    lVar5 = lVar5 + 0x200;
  } while (lVar11 != 4);
  p->matchPriceCount = 0;
  return;
}

Assistant:

static void FillDistancesPrices(CLzmaEnc* p) {
  UInt32 tempPrices[kNumFullDistances];
  UInt32 i, lenToPosState;
  for (i = kStartPosModelIndex; i < kNumFullDistances; i++) {
    UInt32 posSlot = GetPosSlot1(i);
    UInt32 footerBits = ((posSlot >> 1) - 1);
    UInt32 base = ((2 | (posSlot & 1)) << footerBits);
    tempPrices[i] = RcTree_ReverseGetPrice(p->posEncoders + base - posSlot - 1, footerBits, i - base, p->ProbPrices);
  }

  for (lenToPosState = 0; lenToPosState < kNumLenToPosStates; lenToPosState++) {
    UInt32 posSlot;
    const CLzmaProb* encoder = p->posSlotEncoder[lenToPosState];
    UInt32* posSlotPrices = p->posSlotPrices[lenToPosState];
    for (posSlot = 0; posSlot < p->distTableSize; posSlot++)
      posSlotPrices[posSlot] = RcTree_GetPrice(encoder, kNumPosSlotBits, posSlot, p->ProbPrices);
    for (posSlot = kEndPosModelIndex; posSlot < p->distTableSize; posSlot++)
      posSlotPrices[posSlot] += ((((posSlot >> 1) - 1) - kNumAlignBits) << kNumBitPriceShiftBits);

    {
      UInt32* distancesPrices = p->distancesPrices[lenToPosState];
      UInt32 i;
      for (i = 0; i < kStartPosModelIndex; i++)
        distancesPrices[i] = posSlotPrices[i];
      for (; i < kNumFullDistances; i++)
        distancesPrices[i] = posSlotPrices[GetPosSlot1(i)] + tempPrices[i];
    }
  }
  p->matchPriceCount = 0;
}